

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void backupUpdate(sqlite3_backup *p,Pgno iPage,u8 *aData)

{
  int iVar1;
  int rc;
  u8 *aData_local;
  sqlite3_backup *psStack_10;
  Pgno iPage_local;
  sqlite3_backup *p_local;
  
  psStack_10 = p;
  do {
    iVar1 = isFatalError(psStack_10->rc);
    if ((iVar1 == 0) && (iPage < psStack_10->iNext)) {
      sqlite3_mutex_enter(psStack_10->pDestDb->mutex);
      iVar1 = backupOnePage(psStack_10,iPage,aData,1);
      sqlite3_mutex_leave(psStack_10->pDestDb->mutex);
      if (iVar1 != 0) {
        psStack_10->rc = iVar1;
      }
    }
    psStack_10 = psStack_10->pNext;
  } while (psStack_10 != (sqlite3_backup *)0x0);
  return;
}

Assistant:

static SQLITE_NOINLINE void backupUpdate(
  sqlite3_backup *p,
  Pgno iPage,
  const u8 *aData
){
  assert( p!=0 );
  do{
    assert( sqlite3_mutex_held(p->pSrc->pBt->mutex) );
    if( !isFatalError(p->rc) && iPage<p->iNext ){
      /* The backup process p has already copied page iPage. But now it
      ** has been modified by a transaction on the source pager. Copy
      ** the new data into the backup.
      */
      int rc;
      assert( p->pDestDb );
      sqlite3_mutex_enter(p->pDestDb->mutex);
      rc = backupOnePage(p, iPage, aData, 1);
      sqlite3_mutex_leave(p->pDestDb->mutex);
      assert( rc!=SQLITE_BUSY && rc!=SQLITE_LOCKED );
      if( rc!=SQLITE_OK ){
        p->rc = rc;
      }
    }
  }while( (p = p->pNext)!=0 );
}